

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *bitD)

{
  size_t *psVar1;
  
  if (bitD->limitPtr <= bitD->ptr) {
    psVar1 = (size_t *)(bitD->ptr + -(ulong)(bitD->bitsConsumed >> 3));
    bitD->ptr = (char *)psVar1;
    bitD->bitsConsumed = bitD->bitsConsumed & 7;
    bitD->bitContainer = *psVar1;
    return BIT_DStream_unfinished;
  }
  return BIT_DStream_overflow;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t* bitD)
{
    if (UNLIKELY(bitD->ptr < bitD->limitPtr))
        return BIT_DStream_overflow;
    assert(bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8);
    bitD->ptr -= bitD->bitsConsumed >> 3;
    bitD->bitsConsumed &= 7;
    bitD->bitContainer = MEM_readLEST(bitD->ptr);
    return BIT_DStream_unfinished;
}